

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::CmdLine::set_arg(string *name,bool value)

{
  ArgType AVar1;
  Environment *pEVar2;
  bool local_5b;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  local_5b = value;
  AVar1 = get_arg_type(name);
  if ((AVar1 & ~(ARG_BOOL|ARG_STRING)) == ARG_UNDEFINED) {
    pEVar2 = Environment::instance();
    String::to_string<bool>(&local_58,&local_5b);
    (*(pEVar2->super_Counted)._vptr_Counted[4])(pEVar2,name,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_58,"((type) & ~(ARG_BOOL | ARG_STRING)) == 0",&local_59);
  std::__cxx11::string::string
            ((string *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
             ,&local_5a);
  geo_assertion_failed(&local_58,&local_38,0xb5a);
}

Assistant:

void set_arg(const std::string& name, bool value) {
            ArgType type = get_arg_type(name);
            geo_assert_arg_type(type, ARG_BOOL | ARG_STRING);
            Environment::instance()->set_value(name, String::to_string(value));
        }